

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantValue.cpp
# Opt level: O0

ConstantRange __thiscall slang::ConstantRange::intersect(ConstantRange *this,ConstantRange other)

{
  ConstantRange CVar1;
  bool bVar2;
  int *piVar3;
  ConstantRange in_RSI;
  ConstantRange result;
  int32_t local_30;
  int32_t local_2c;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  ConstantRange local_8;
  
  bVar2 = overlaps((ConstantRange *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                   in_RSI);
  if (bVar2) {
    ConstantRange(&local_8);
    lower((ConstantRange *)0x56bce4);
    lower((ConstantRange *)0x56bcf2);
    piVar3 = std::max<int>((int *)&stack0xffffffffffffffdc,(int *)&stack0xffffffffffffffd8);
    local_8.left = *piVar3;
    local_2c = upper((ConstantRange *)0x56bd14);
    local_30 = upper((ConstantRange *)0x56bd22);
    piVar3 = std::min<int>(&local_2c,&local_30);
    local_8.right = *piVar3;
  }
  else {
    memset(&local_8,0,8);
    ConstantRange(&local_8);
  }
  CVar1.right = local_8.right;
  CVar1.left = local_8.left;
  return CVar1;
}

Assistant:

ConstantRange ConstantRange::intersect(ConstantRange other) const {
    if (overlaps(other)) {
        ConstantRange result;
        result.left = std::max(lower(), other.lower());
        result.right = std::min(upper(), other.upper());
        return result;
    }
    return ConstantRange();
}